

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.c
# Opt level: O0

token * abstract_array_declarator(dmr_C *C,token *token,symbol *sym)

{
  int iVar1;
  token *ptVar2;
  int local_2c;
  expression *peStack_28;
  int has_static;
  expression *expr;
  symbol *sym_local;
  token *token_local;
  dmr_C *C_local;
  
  peStack_28 = (expression *)0x0;
  local_2c = 0;
  expr = (expression *)sym;
  sym_local = (symbol *)token;
  token_local = (token *)C;
  sym_local = (symbol *)abstract_array_static_declarator(C,token,&local_2c);
  iVar1 = match_idents((dmr_C *)token_local,(token *)sym_local,
                       token_local->next[0x16d].field_2.number,token_local->next[0x16e].pos,
                       token_local->next[0x16e].next,0);
  if (iVar1 != 0) {
    sym_local = (symbol *)
                abstract_array_static_declarator
                          ((dmr_C *)token_local,*(token **)&(sym_local->pos).field_0x4,&local_2c);
  }
  ptVar2 = dmrC_parse_expression((dmr_C *)token_local,(token *)sym_local,&stack0xffffffffffffffd8);
  *(expression **)&expr[1].field_0x18 = peStack_28;
  return ptVar2;
}

Assistant:

static struct token *abstract_array_declarator(struct dmr_C *C, struct token *token, struct symbol *sym)
{
	struct expression *expr = NULL;
	int has_static = 0;

	token = abstract_array_static_declarator(C, token, &has_static);

	if (match_idents(C, token, C->S->restrict_ident, C->S->__restrict_ident, C->S->__restrict___ident, NULL))
		token = abstract_array_static_declarator(C, token->next, &has_static);
	token = dmrC_parse_expression(C, token, &expr);
	sym->array_size = expr;
	return token;
}